

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

bool __thiscall
GF2::MP<45ul,GF2::MOGrlex<45ul>>::ModGB<GF2::MOGrlex<45ul>>
          (MP<45ul,GF2::MOGrlex<45ul>> *this,MP<45UL,_GF2::MOGrlex<45UL>_> *polyRight)

{
  bool bVar1;
  MP<45UL,_GF2::MOGrlex<45UL>_> *pMVar2;
  bool bVar3;
  MM<45UL> lm;
  MP<45UL,_GF2::MOGrlex<45UL>_> poly;
  Geobucket<4UL> gb;
  MM<45UL> local_88;
  _List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> local_80;
  Geobucket<4UL> local_60;
  
  MP<45UL,_GF2::MOGrlex<45UL>_>::Geobucket<4UL>::Geobucket
            (&local_60,(MP<45UL,_GF2::MOGrlex<45UL>_> *)this);
  std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::clear
            ((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)this);
  local_88.super_WW<45UL>._words[0] = (WW<45UL>)(word  [1])0x0;
  local_80._M_impl._M_node._M_size = 0;
  bVar3 = false;
  local_80._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_80;
  local_80._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_80;
  while( true ) {
    bVar1 = MP<45UL,_GF2::MOGrlex<45UL>_>::Geobucket<4UL>::PopLM(&local_60,&local_88);
    if (!bVar1) break;
    if (((ulong)(polyRight->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>).
                super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
                super__List_node_base._M_next[1]._M_next & ~(ulong)local_88.super_WW<45UL>._words[0]
        ) == 0) {
      pMVar2 = MP<45UL,_GF2::MOGrlex<45UL>_>::operator=
                         ((MP<45UL,_GF2::MOGrlex<45UL>_> *)&local_80,polyRight);
      std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::pop_front
                (&pMVar2->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>);
      local_88.super_WW<45UL>._words[0] =
           (WW<45UL>)
           ((ulong)local_88.super_WW<45UL>._words[0] &
           ~(ulong)(polyRight->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>).
                   super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
                   super__List_node_base._M_next[1]._M_next);
      pMVar2 = MP<45UL,_GF2::MOGrlex<45UL>_>::operator*=
                         ((MP<45UL,_GF2::MOGrlex<45UL>_> *)&local_80,&local_88);
      bVar3 = true;
      MP<45UL,_GF2::MOGrlex<45UL>_>::Geobucket<4UL>::SymDiffSplice(&local_60,pMVar2);
    }
    else {
      std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::push_back
                ((list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)this,&local_88);
    }
  }
  std::__cxx11::_List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::_M_clear(&local_80);
  MP<45UL,_GF2::MOGrlex<45UL>_>::Geobucket<4UL>::~Geobucket(&local_60);
  return bVar3;
}

Assistant:

bool ModGB(const MP<_n, _O1>& polyRight)
	{	
		// поскольку операция выбора старшего монома задействована,
		// коэффициент роста geobucket выберем равным 4
		Geobucket<4> gb(*this);
		// будем сохранять в this остаток
		SetEmpty();
		// цикл деления
		bool changed = false;
		MM<_n> lm;
		MP poly(_order);
		while (gb.PopLM(lm))
			// делимость старших мономов?
			if (lm.IsDivisibleBy(polyRight.LM()))
			{
				changed = true;
				// готовим множитель
				(poly = polyRight).PopLM();
				// перемножаем и добавляем в geobucket
                gb.SymDiffSplice(poly *= (lm /= polyRight.LM()));
			}
			else
				// заносим lm в остаток
				push_back(lm);
		return changed;
	}